

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O1

void __thiscall Diligent::DescriptorPoolManager::~DescriptorPoolManager(DescriptorPoolManager *this)

{
  _Map_pointer ppVVar1;
  pointer pVVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char (*in_R9) [9];
  string msg;
  string local_38;
  long local_18;
  
  if ((this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i != 0) {
    FormatString<char[68]>
              (&local_38,
               (char (*) [68])"Not all allocated descriptor pools are returned to the pool manager")
    ;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"~DescriptorPoolManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DescriptorPoolManager.cpp"
               ,0x66);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  ppVVar1 = (this->m_Pools).
            super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_18 = ((long)(this->m_Pools).
                    super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)(this->m_Pools).
                    super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
             ((long)(this->m_Pools).
                    super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(this->m_Pools).
                    super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
             (((long)ppVVar1 -
               (long)(this->m_Pools).
                     super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
             (ulong)(ppVVar1 == (_Map_pointer)0x0)) * 0x15;
  FormatString<std::__cxx11::string,char[19],unsigned_long,char[9]>
            (&local_38,(Diligent *)&this->m_PoolName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             " stats: allocated ",(char (*) [19])&local_18,(unsigned_long *)" pool(s)",in_R9);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,local_38._M_dataplus._M_p,0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ::~deque(&this->m_Pools);
  pVVar2 = (this->m_PoolSizes).
           super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2,(long)(this->m_PoolSizes).
                                 super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar2);
  }
  pcVar3 = (this->m_PoolName)._M_dataplus._M_p;
  paVar4 = &(this->m_PoolName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

DescriptorPoolManager::~DescriptorPoolManager()
{
    DEV_CHECK_ERR(m_AllocatedPoolCounter == 0, "Not all allocated descriptor pools are returned to the pool manager");
    LOG_INFO_MESSAGE(m_PoolName, " stats: allocated ", m_Pools.size(), " pool(s)");
}